

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall QPDFJob::initializeFromArgv(QPDFJob *this,char **argv,char *progname_env)

{
  QPDFJob local_150;
  undefined1 local_140 [8];
  ArgParser ap;
  string local_60;
  undefined1 local_40 [8];
  QPDFArgParser qap;
  char **k;
  char *pcStack_20;
  int argc;
  char *progname_env_local;
  char **argv_local;
  QPDFJob *this_local;
  
  pcStack_20 = progname_env;
  if (progname_env == (char *)0x0) {
    pcStack_20 = "QPDF_EXECUTABLE";
  }
  k._4_4_ = 0;
  for (qap.m.super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
      (qap.m.super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_vptr__Sp_counted_base != (_func_int **)0x0;
      qap.m.super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             &(qap.m.super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count) {
    k._4_4_ = k._4_4_ + 1;
  }
  QPDFArgParser::QPDFArgParser((QPDFArgParser *)local_40,k._4_4_,argv,pcStack_20);
  QPDFArgParser::getProgname_abi_cxx11_(&local_60,(QPDFArgParser *)local_40);
  setMessagePrefix(this,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  config(&local_150);
  anon_unknown.dwarf_291698::ArgParser::ArgParser
            ((ArgParser *)local_140,(QPDFArgParser *)local_40,
             (shared_ptr<QPDFJob::Config> *)&local_150);
  std::shared_ptr<QPDFJob::Config>::~shared_ptr((shared_ptr<QPDFJob::Config> *)&local_150);
  anon_unknown.dwarf_291698::ArgParser::parseOptions((ArgParser *)local_140);
  anon_unknown.dwarf_291698::ArgParser::~ArgParser((ArgParser *)local_140);
  QPDFArgParser::~QPDFArgParser((QPDFArgParser *)local_40);
  return;
}

Assistant:

void
QPDFJob::initializeFromArgv(char const* const argv[], char const* progname_env)
{
    if (progname_env == nullptr) {
        progname_env = "QPDF_EXECUTABLE";
    }
    int argc = 0;
    for (auto k = argv; *k; ++k) {
        ++argc;
    }
    QPDFArgParser qap(argc, argv, progname_env);
    setMessagePrefix(qap.getProgname());
    ArgParser ap(qap, config());
    ap.parseOptions();
}